

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error ft_stroker_inside(PVG_FT_Stroker stroker,PVG_FT_Int side,PVG_FT_Fixed line_length)

{
  ulong uVar1;
  PVG_FT_Error PVar2;
  PVG_FT_Angle PVar3;
  PVG_FT_Long PVar4;
  long lVar5;
  long lVar6;
  PVG_FT_Vector local_58;
  PVG_FT_Vector sigma;
  
  uVar1 = (ulong)(uint)side;
  sigma.x = 0;
  sigma.y = 0;
  lVar6 = uVar1 * -0xb40000 + 0x5a0000;
  PVar3 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if ((0xfffffffffe98fffc < PVar3 - 0xb38002U && line_length != 0) &&
      stroker->borders[uVar1].movable != '\0') {
    PVG_FT_Vector_Unit(&sigma,PVar3 / 2);
    PVar4 = PVG_FT_MulDiv(stroker->radius,sigma.y,sigma.x);
    if (PVar4 != 0) {
      lVar5 = -PVar4;
      if (0 < PVar4) {
        lVar5 = PVar4;
      }
      if ((lVar5 <= line_length) && (lVar5 <= stroker->line_length)) {
        lVar5 = stroker->angle_in;
        PVar4 = PVG_FT_DivFix(stroker->radius,sigma.x);
        PVG_FT_Vector_From_Polar(&local_58,PVar4,PVar3 / 2 + lVar6 + lVar5);
        local_58.x = (stroker->center).x + local_58.x;
        local_58.y = (stroker->center).y + local_58.y;
        goto LAB_0011e6ed;
      }
    }
  }
  PVG_FT_Vector_From_Polar(&local_58,stroker->radius,lVar6 + stroker->angle_out);
  local_58.x = (stroker->center).x + local_58.x;
  local_58.y = (stroker->center).y + local_58.y;
  stroker->borders[uVar1].movable = '\0';
LAB_0011e6ed:
  PVar2 = ft_stroke_border_lineto(stroker->borders + uVar1,&local_58,'\0');
  return PVar2;
}

Assistant:

static PVG_FT_Error ft_stroker_inside(PVG_FT_Stroker stroker, PVG_FT_Int side,
                                     PVG_FT_Fixed line_length)
{
    PVG_FT_StrokeBorder border = stroker->borders + side;
    PVG_FT_Angle        phi, theta, rotate;
    PVG_FT_Fixed        length;
    PVG_FT_Vector       sigma = {0, 0};
    PVG_FT_Vector       delta;
    PVG_FT_Error        error = 0;
    PVG_FT_Bool         intersect; /* use intersection of lines? */

    rotate = PVG_FT_SIDE_TO_ROTATE(side);

    theta = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out) / 2;

    /* Only intersect borders if between two lineto's and both */
    /* lines are long enough (line_length is zero for curves). */
    if (!border->movable || line_length == 0  ||
         theta > 0x59C000 || theta < -0x59C000 )
        intersect = FALSE;
    else {
      /* compute minimum required length of lines */
      PVG_FT_Fixed  min_length;


      PVG_FT_Vector_Unit( &sigma, theta );
      min_length =
        ft_pos_abs( PVG_FT_MulDiv( stroker->radius, sigma.y, sigma.x ) );

      intersect = PVG_FT_BOOL( min_length                         &&
                           stroker->line_length >= min_length &&
                           line_length          >= min_length );
    }

    if (!intersect) {
        PVG_FT_Vector_From_Polar(&delta, stroker->radius,
                                stroker->angle_out + rotate);
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        border->movable = FALSE;
    } else {
        /* compute median angle */
        phi = stroker->angle_in + theta + rotate;

      length = PVG_FT_DivFix( stroker->radius, sigma.x );

      PVG_FT_Vector_From_Polar( &delta, length, phi );
      delta.x += stroker->center.x;
      delta.y += stroker->center.y;
    }

    error = ft_stroke_border_lineto(border, &delta, FALSE);

    return error;
}